

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::HlslParseContext::flatten
          (HlslParseContext *this,TVariable *variable,bool linkage,bool arrayed)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TPoolAllocator *pTVar5;
  undefined4 extraout_var_03;
  TQualifier *outerQualifier;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  TString *name;
  pair<std::_Rb_tree_iterator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>,_bool>
  pVar6;
  TArraySizes *builtInArraySizes;
  TString local_118;
  TString local_f0;
  TType dereferencedType;
  TType *type;
  undefined4 extraout_var_04;
  
  iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
  type = (TType *)CONCAT44(extraout_var,iVar3);
  iVar3 = (*type->_vptr_TType[0x29])(type);
  if (((char)iVar3 != '\0') && (iVar3 = (*type->_vptr_TType[0x25])(type), (char)iVar3 == '\0')) {
    return;
  }
  iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[0xf])(variable);
  iVar4 = (*type->_vptr_TType[0xb])(type);
  uVar1 = *(ulong *)(CONCAT44(extraout_var_01,iVar4) + 0x1c);
  iVar4 = (*type->_vptr_TType[0xb])(type);
  lVar2 = *(long *)(CONCAT44(extraout_var_02,iVar4) + 0x1c);
  pTVar5 = GetThreadPoolAllocator();
  dereferencedType.qualifier._24_8_ = GetThreadPoolAllocator();
  dereferencedType.qualifier._56_8_ = (lVar2 << 0x20 | uVar1 >> 0x20) & 0xfff0000ffff;
  dereferencedType.qualifier.semanticName = (char *)0x0;
  dereferencedType.qualifier._8_8_ = 0;
  dereferencedType.qualifier._16_4_ = 0;
  dereferencedType.qualifier.layoutOffset = 0;
  dereferencedType.qualifier._32_8_ = 0;
  dereferencedType.qualifier._40_5_ = 0;
  dereferencedType.qualifier.layoutPushConstant = false;
  dereferencedType.qualifier.layoutBufferReference = false;
  dereferencedType.qualifier.layoutPassthrough = false;
  dereferencedType.qualifier.layoutViewportRelative = false;
  dereferencedType.qualifier._49_3_ = 0;
  dereferencedType.qualifier.layoutSecondaryViewportRelativeOffset = 0;
  dereferencedType._vptr_TType = (_func_int **)CONCAT44(extraout_var_00,iVar3);
  dereferencedType._8_8_ = pTVar5;
  pVar6 = std::
          _Rb_tree<long_long,std::pair<long_long_const,glslang::HlslParseContext::TFlattenData>,std::_Select1st<std::pair<long_long_const,glslang::HlslParseContext::TFlattenData>>,std::less<long_long>,glslang::pool_allocator<std::pair<long_long_const,glslang::HlslParseContext::TFlattenData>>>
          ::_M_emplace_unique<std::pair<long_long,glslang::HlslParseContext::TFlattenData>>
                    ((_Rb_tree<long_long,std::pair<long_long_const,glslang::HlslParseContext::TFlattenData>,std::_Select1st<std::pair<long_long_const,glslang::HlslParseContext::TFlattenData>>,std::less<long_long>,glslang::pool_allocator<std::pair<long_long_const,glslang::HlslParseContext::TFlattenData>>>
                      *)&this->flattenMap,
                     (pair<long_long,_glslang::HlslParseContext::TFlattenData> *)&dereferencedType);
  iVar3 = (*type->_vptr_TType[0x25])(type);
  if ((char)iVar3 != '\0') {
    iVar3 = (*type->_vptr_TType[0x25])(type);
    if ((char)iVar3 == '\0') {
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
    }
    if ((((type->field_13).structure)->
        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (((type->field_13).structure)->
        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
        super__Vector_impl_data._M_start) {
      return;
    }
  }
  if (arrayed) {
    TType::TType(&dereferencedType,type,0,false);
    iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[3])(variable);
    local_f0._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    lVar2 = *(long *)(CONCAT44(extraout_var_03,iVar3) + 8);
    name = &local_f0;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                        name,lVar2,*(long *)(CONCAT44(extraout_var_03,iVar3) + 0x10) + lVar2);
    iVar3 = (*type->_vptr_TType[0xb])(type);
    outerQualifier = (TQualifier *)CONCAT44(extraout_var_04,iVar3);
    iVar3 = (*type->_vptr_TType[0x13])(type);
    builtInArraySizes = (TArraySizes *)CONCAT44(extraout_var_05,iVar3);
    type = &dereferencedType;
  }
  else {
    iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[3])(variable);
    local_118._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    lVar2 = *(long *)(CONCAT44(extraout_var_06,iVar3) + 8);
    name = &local_118;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                        name,lVar2,*(long *)(CONCAT44(extraout_var_06,iVar3) + 0x10) + lVar2);
    iVar3 = (*type->_vptr_TType[0xb])(type);
    outerQualifier = (TQualifier *)CONCAT44(extraout_var_07,iVar3);
    builtInArraySizes = (TArraySizes *)0x0;
  }
  flatten(this,variable,type,(TFlattenData *)&pVar6.first._M_node._M_node[1]._M_parent,name,linkage,
          outerQualifier,builtInArraySizes);
  return;
}

Assistant:

void HlslParseContext::flatten(const TVariable& variable, bool linkage, bool arrayed)
{
    const TType& type = variable.getType();

    // If it's a standalone built-in, there is nothing to flatten
    if (type.isBuiltIn() && !type.isStruct())
        return;


    auto entry = flattenMap.insert(std::make_pair(variable.getUniqueId(),
                                                  TFlattenData(type.getQualifier().layoutBinding,
                                                               type.getQualifier().layoutLocation)));

    if (type.isStruct() && type.getStruct()->size()==0)
        return;
    // if flattening arrayed io struct, array each member of dereferenced type
    if (arrayed) {
        const TType dereferencedType(type, 0);
        flatten(variable, dereferencedType, entry.first->second, variable.getName(), linkage,
                type.getQualifier(), type.getArraySizes());
    } else {
        flatten(variable, type, entry.first->second, variable.getName(), linkage,
                type.getQualifier(), nullptr);
    }
}